

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client,_true>::get
          (ForkBranch<capnproto_test::capnp::test::TestInterface::Client,_true> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *pEVar1;
  Client local_48;
  Client *local_30;
  Client *value;
  Client *_value846;
  ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<capnproto_test::capnp::test::TestInterface::Client,_true> *this_local;
  
  hubResult = (ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  _value846 = (Client *)
              ExceptionOrValue::as<capnproto_test::capnp::test::TestInterface::Client>(this_00);
  value = readMaybe<capnproto_test::capnp::test::TestInterface::Client>
                    (&((ExceptionOr<capnproto_test::capnp::test::TestInterface::Client> *)_value846)
                      ->value);
  if (value == (Client *)0x0) {
    pEVar1 = ExceptionOrValue::as<capnproto_test::capnp::test::TestInterface::Client>
                       (&hubResult->super_ExceptionOrValue);
    Maybe<capnproto_test::capnp::test::TestInterface::Client>::operator=(&pEVar1->value);
  }
  else {
    local_30 = value;
    copyOrAddRef<capnproto_test::capnp::test::TestInterface::Client>(&local_48,value);
    pEVar1 = ExceptionOrValue::as<capnproto_test::capnp::test::TestInterface::Client>
                       (&hubResult->super_ExceptionOrValue);
    Maybe<capnproto_test::capnp::test::TestInterface::Client>::operator=(&pEVar1->value,&local_48);
    capnproto_test::capnp::test::TestInterface::Client::~Client(&local_48);
  }
  Maybe<kj::Exception>::operator=
            ((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)_value846);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }